

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::makeMask(Image *this)

{
  uint8 *puVar1;
  ulong uVar2;
  byte *pbVar3;
  int32 y;
  int iVar4;
  ulong uVar5;
  int32 x;
  int iVar6;
  byte bVar7;
  byte *pbVar8;
  
  iVar4 = this->depth;
  switch(iVar4 << 0x1e | iVar4 - 4U >> 2) {
  case 0:
  case 1:
    bVar7 = (byte)iVar4 & 0x1f;
    uVar5 = 0;
    uVar2 = (ulong)(uint)(1 << bVar7);
    if (1 << bVar7 < 1) {
      uVar2 = uVar5;
    }
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      puVar1 = this->palette;
      bVar7 = puVar1[uVar5 * 4];
      if (puVar1[uVar5 * 4] < puVar1[uVar5 * 4 + 1]) {
        bVar7 = puVar1[uVar5 * 4 + 1];
      }
      if (bVar7 < puVar1[uVar5 * 4 + 2]) {
        bVar7 = puVar1[uVar5 * 4 + 2];
      }
      puVar1[uVar5 * 4 + 3] = bVar7;
    }
    break;
  case 3:
  case 5:
    convertTo32(this);
  case 7:
    pbVar3 = this->pixels;
    for (iVar4 = 0; iVar4 < this->height; iVar4 = iVar4 + 1) {
      pbVar8 = pbVar3;
      for (iVar6 = 0; iVar6 < this->width; iVar6 = iVar6 + 1) {
        bVar7 = *pbVar8;
        if (*pbVar8 < pbVar8[1]) {
          bVar7 = pbVar8[1];
        }
        if (bVar7 < pbVar8[2]) {
          bVar7 = pbVar8[2];
        }
        pbVar8[3] = bVar7;
        pbVar8 = pbVar8 + this->bpp;
      }
      pbVar3 = pbVar3 + this->stride;
    }
  }
  return;
}

Assistant:

void
Image::makeMask(void)
{
	int32 maxcol;
	switch(this->depth){
	case 4:
	case 8: {
		assert(this->palette);
		int32 pallen = 1 << this->depth;
		for(int32 i = 0; i < pallen; i++){
			maxcol = this->palette[i*4+0];
			if(this->palette[i*4+1] > maxcol) maxcol = this->palette[i*4+1];
			if(this->palette[i*4+2] > maxcol) maxcol = this->palette[i*4+2];
			this->palette[i*4+3] = maxcol;
		}
		break;
	}

	case 16:
	case 24:
		this->convertTo32();
		// fallthrough

	case 32: {
		assert(this->pixels);
		uint8 *line = this->pixels;
		uint8 *p;
		for(int32 y = 0; y < this->height; y++){
			p = line;
			for(int32 x = 0; x < this->width; x++){
				maxcol = p[0];
				if(p[1] > maxcol) maxcol = p[1];
				if(p[2] > maxcol) maxcol = p[2];
				p[3] = maxcol;
				p += this->bpp;
			}
			line += this->stride;
		}
		break;
	}
	}
}